

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

Aggregate * __thiscall
hta::Metric::aggregate_raw
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end)

{
  Aggregate other;
  Aggregate other_00;
  TimePoint TVar1;
  bool bVar2;
  pointer pMVar3;
  reference pTVar4;
  rep rVar5;
  type active_time;
  Aggregate local_138;
  Value local_108;
  Value VStack_100;
  Value local_f8;
  Value VStack_f0;
  uint64_t local_e8;
  Value VStack_e0;
  undefined1 auStack_d0 [8];
  Aggregate partial_interval;
  type partial_duration;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tStack_88;
  TimeValue tv;
  __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  local_70;
  const_iterator __end1;
  const_iterator __begin1;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__range1;
  TimePoint previous_time;
  undefined1 local_38 [8];
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw;
  Metric *this_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  raw.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_local = (Metric *)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  end_local = begin;
  Aggregate::Aggregate(__return_storage_ptr__);
  pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  previous_time.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r.
  _0_4_ = 1;
  previous_time.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r.
  _4_4_ = 2;
  (*pMVar3->_vptr_Metric[5])
            (local_38,pMVar3,
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r,this_local,0x200000001);
  __range1 = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
  __end1 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::begin
                     ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_38);
  local_70._M_current =
       (TimeValue *)
       std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::end
                 ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&local_70);
    if (!bVar2) {
      std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~vector
                ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_38);
      return __return_storage_ptr__;
    }
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ::operator*(&__end1);
    tStack_88.__d.__r =
         (duration)
         (pTVar4->time).
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    tv.time.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               pTVar4->value;
    bVar2 = std::chrono::operator<=
                      ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&__range1,&tStack_88);
    if (!bVar2) break;
    bVar2 = std::chrono::operator>=
                      (&tStack_88,
                       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local);
    TVar1 = tv.time;
    if (bVar2) {
      partial_interval.active_time.__r =
           (rep)std::chrono::operator-
                          ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&this_local,
                           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&__range1);
      TVar1 = tv.time;
      rVar5 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        (&partial_interval.active_time);
      Aggregate::Aggregate
                ((Aggregate *)auStack_d0,
                 (Value)TVar1.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,
                 (Value)TVar1.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,0.0,0,
                 (double)TVar1.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r * (double)rVar5,&partial_interval.active_time);
      local_e8 = partial_interval.count;
      VStack_e0 = partial_interval.integral;
      local_f8 = partial_interval.maximum;
      VStack_f0 = partial_interval.sum;
      local_108 = (Value)auStack_d0;
      VStack_100 = partial_interval.minimum;
      other.maximum = partial_interval.minimum;
      other.minimum = (Value)auStack_d0;
      other.sum = partial_interval.maximum;
      other.count = (uint64_t)partial_interval.sum;
      other.integral = (Value)partial_interval.count;
      other.active_time.__r = (rep)partial_interval.integral;
      Aggregate::operator+=(__return_storage_ptr__,other);
    }
    else {
      active_time = std::chrono::operator-
                              (&tStack_88,
                               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&__range1);
      Aggregate::Aggregate
                (&local_138,
                 (Value)TVar1.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,(Duration)active_time.__r);
      other_00.maximum = local_138.maximum;
      other_00.minimum = local_138.minimum;
      other_00.sum = local_138.sum;
      other_00.count = local_138.count;
      other_00.integral = local_138.integral;
      other_00.active_time.__r = local_138.active_time.__r;
      Aggregate::operator+=(__return_storage_ptr__,other_00);
    }
    __range1 = (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)tStack_88.__d.__r;
    __gnu_cxx::
    __normal_iterator<const_hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("previous_time <= tv.time",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x78,"Aggregate hta::Metric::aggregate_raw(TimePoint, TimePoint)");
}

Assistant:

Aggregate Metric::aggregate_raw(TimePoint begin, TimePoint end)
{
    Aggregate aggregate;
    const auto raw =
        storage_metric_->get(begin, end, IntervalScope{ Scope::closed, Scope::extended });
    auto previous_time = begin;
    for (auto tv : raw)
    {
        assert(previous_time <= tv.time);
        if (tv.time >= end)
        {
            // We add this for the integral but the point isn't actually in
            auto partial_duration = end - previous_time;
            Aggregate partial_interval{
                tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
            };
            aggregate += partial_interval;
        }
        else
        {
            aggregate += Aggregate(tv.value, tv.time - previous_time);
        }
        previous_time = tv.time;
    }
    return aggregate;
}